

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dom.hpp
# Opt level: O0

void __thiscall
crawler::Node::Node(Node *this,string *_name,AttrMap *_attrMap,
                   vector<crawler::Node,_std::allocator<crawler::Node>_> *_children,
                   shared_ptr<crawler::Node> *_parent)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e0;
  string local_a0;
  undefined1 local_80 [8];
  ElementData elementData;
  shared_ptr<crawler::Node> *_parent_local;
  vector<crawler::Node,_std::allocator<crawler::Node>_> *_children_local;
  AttrMap *_attrMap_local;
  string *_name_local;
  Node *this_local;
  
  elementData.attributes._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)_parent;
  std::vector<crawler::Node,_std::allocator<crawler::Node>_>::vector(&this->children);
  std::
  variant<crawler::ElementData,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::variant(&this->nodeData);
  std::shared_ptr<crawler::Node>::shared_ptr(&this->parent);
  std::vector<crawler::Node,_std::allocator<crawler::Node>_>::operator=(&this->children,_children);
  std::shared_ptr<crawler::Node>::operator=
            (&this->parent,
             (shared_ptr<crawler::Node> *)
             elementData.attributes._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::string((string *)&local_a0,(string *)_name);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&local_e0,_attrMap);
  ElementData::ElementData((ElementData *)local_80,&local_a0,&local_e0);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&local_e0);
  std::__cxx11::string::~string((string *)&local_a0);
  this->nodeType = Element;
  std::variant<crawler::ElementData,std::__cxx11::string>::operator=
            ((variant<crawler::ElementData,std::__cxx11::string> *)&this->nodeData,
             (ElementData *)local_80);
  ElementData::~ElementData((ElementData *)local_80);
  return;
}

Assistant:

explicit Node(const std::string &_name, const AttrMap &_attrMap,
                std::vector<Node> _children,
                const std::shared_ptr<Node> &_parent) {
    children = std::move(_children);
    parent = _parent;
    ElementData elementData(_name, _attrMap);
    nodeType = NodeType::Element;
    nodeData = elementData;
  }